

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhttp.c
# Opt level: O0

int process_status_code_line(uchar *buffer,size_t len,size_t *position,int *statusLen)

{
  long lVar1;
  undefined2 local_4c;
  uchar local_4a;
  undefined1 local_49;
  uchar *puStack_48;
  char status_code [4];
  char *initSpace;
  ulong uStack_38;
  int spaceFound;
  size_t index;
  int result;
  int *statusLen_local;
  size_t *position_local;
  size_t len_local;
  uchar *buffer_local;
  
  initSpace._4_4_ = 0;
  puStack_48 = (uchar *)0x0;
  memset(&local_4c,0,4);
  uStack_38 = 0;
  do {
    if (len <= uStack_38) {
      return 0x89;
    }
    if (buffer[uStack_38] == ' ') {
      if (initSpace._4_4_ == 1) {
        local_4c = *(undefined2 *)puStack_48;
        local_4a = puStack_48[2];
        local_49 = 0;
      }
      else {
        puStack_48 = buffer + uStack_38 + 1;
      }
      initSpace._4_4_ = initSpace._4_4_ + 1;
    }
    else if (buffer[uStack_38] == '\n') {
      lVar1 = atol((char *)&local_4c);
      *statusLen = (int)lVar1;
      if (uStack_38 < len) {
        *position = uStack_38 + 1;
      }
      else {
        *position = uStack_38;
      }
      return 0;
    }
    uStack_38 = uStack_38 + 1;
  } while( true );
}

Assistant:

static int process_status_code_line(const unsigned char* buffer, size_t len, size_t* position, int* statusLen)
{
    int result = MU_FAILURE;
    size_t index;
    int spaceFound = 0;
    const char* initSpace = NULL;
    char status_code[4] = { 0 };

    for (index = 0; index < len; index++)
    {
        if (buffer[index] == ' ')
        {
            if (spaceFound == 1)
            {
                (void)memcpy(status_code, initSpace, 3);
                status_code[3] = '\0';
            }
            else
            {
                initSpace = (const char*)buffer + index + 1;
            }
            spaceFound++;
        }
        else if (buffer[index] == '\n')
        {
            *statusLen = (int)atol(status_code);
            if (index < len)
            {
                *position = index + 1;
            }
            else
            {
                *position = index;
            }
            result = 0;
            break;
        }
    }
    return result;
}